

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean mh2ad(Integer memhandle,AD **adout,BlockLocation location,char *caller)

{
  Pointer pcVar1;
  Boolean BVar2;
  AD *ad;
  byte bVar3;
  char *pcVar4;
  char *__format;
  
  bVar3 = (byte)location & 0xf;
  BVar2 = ma_table_verify(memhandle,caller);
  if (BVar2 == 0) {
    return 0;
  }
  ad = (AD *)ma_table_lookup(memhandle);
  if ((ad < ma_segment) || (ma_eos <= ad)) {
    __format = "invalid block address (0x%lx) for memhandle %ld";
    pcVar4 = (char *)memhandle;
    goto LAB_00150984;
  }
  pcVar1 = ad->client_space;
  if (pcVar1 + ad->nbytes + ad->nelem + ad->datatype == (Pointer)ad->checksum) {
    if ((*(int *)(pcVar1 + -4) == -0x55555556) &&
       (*(int *)(pcVar1 + ad->nelem * (long)ma_sizeof[ad->datatype]) == 0x55555555)) {
      if ((0xdU >> bVar3 & 1) == 0) {
        BVar2 = list_member(ad,ma_hused);
        if (BVar2 != 0) {
LAB_001509eb:
          *adout = ad;
          return 1;
        }
        __format = "memhandle %ld (name: \'%s\') not in heap";
      }
      else if ((0xbU >> bVar3 & 1) == 0) {
        BVar2 = list_member(ad,ma_sused);
        if (BVar2 != 0) goto LAB_001509eb;
LAB_00150a2d:
        __format = "memhandle %ld (name: \'%s\') not in stack";
      }
      else if ((7U >> bVar3 & 1) == 0) {
        BVar2 = list_member(ad,ma_sused);
        if (BVar2 == 0) goto LAB_00150a2d;
        if (ad == (AD *)ma_sp) goto LAB_001509eb;
        __format = "memhandle %ld (name: \'%s\') not top of stack";
      }
      else {
        if ((((0xeU >> bVar3 & 1) != 0) || (BVar2 = list_member(ad,ma_hused), BVar2 != 0)) ||
           (BVar2 = list_member(ad,ma_sused), BVar2 != 0)) goto LAB_001509eb;
        __format = "memhandle %ld (name: \'%s\') not in heap or stack";
      }
    }
    else {
      __format = "invalid guard(s) for memhandle %ld (name: \'%s\')";
    }
  }
  else {
    __format = "invalid checksum for memhandle %ld (name: \'%s\')";
  }
  pcVar4 = ad->name;
  ad = (AD *)memhandle;
LAB_00150984:
  sprintf(ma_ebuf,__format,ad,pcVar4);
  ma_error(EL_Nonfatal,ET_External,caller,ma_ebuf);
  return 0;
}

Assistant:

private Boolean mh2ad(memhandle, adout, location, caller)
    Integer    memhandle;    /* the handle to verify and convert */
    AD        **adout;    /* RETURN: AD corresponding to memhandle */
    BlockLocation location;    /* where AD must reside */
    char    *caller;    /* name of calling routine */
{
    AD        *ad;
    Boolean    check_checksum = MA_TRUE;
    Boolean    check_guards = MA_TRUE;
    Boolean    check_heap = MA_FALSE;
    Boolean    check_stack = MA_FALSE;
    Boolean    check_stacktop = MA_FALSE;
    Boolean    check_heapandstack = MA_FALSE;

    switch (location)
    {
        case BL_HeapOrStack:
            check_heapandstack = MA_TRUE;
            break;
        case BL_Heap:
            check_heap = MA_TRUE;
            break;
        case BL_Stack:
            check_stack = MA_TRUE;
            break;
        case BL_StackTop:
            check_stacktop = MA_TRUE;
            break;
        default:
            (void)sprintf(ma_ebuf,
                "invalid location: %d",
                (int)location);
            ma_error(EL_Nonfatal, ET_Internal, "mh2ad", ma_ebuf);
            return MA_FALSE;
    }

    /* convert memhandle to AD */
    if (!ma_table_verify(memhandle, caller))
        return MA_FALSE;
    else
        ad = (AD *)ma_table_lookup(memhandle);

    /* attempt to avoid crashes due to corrupt addresses */
    if (!reasonable_address((Pointer)ad))
    {
        (void)sprintf(ma_ebuf,
            "invalid block address (0x%lx) for memhandle %ld",
            (size_t)ad, (size_t)memhandle);
        ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
        return MA_FALSE;
    }

    if (check_checksum)
    {
        if (checksum(ad) != ad->checksum)
        {
            (void)sprintf(ma_ebuf,
                "invalid checksum for memhandle %ld (name: '%s')",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }

    if (check_guards)
    {
        if (!guard_check(ad))
        {
            (void)sprintf(ma_ebuf,
                "invalid guard(s) for memhandle %ld (name: '%s')",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }

    if (check_heap)
    {
        if (!list_member(ad, ma_hused))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in heap",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }
    else if (check_stack)
    {
        if (!list_member(ad, ma_sused))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }
    else if (check_stacktop)
    {
        /* is it in the stack? */
        if (!list_member(ad, ma_sused))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }

        /* is it on top of the stack? */
        if ((Pointer)ad != ma_sp)
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not top of stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }
    else if (check_heapandstack)
    {
        if ((!list_member(ad, ma_hused)) && (!list_member(ad, ma_sused)))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in heap or stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }

    /* ad is valid */
    *adout = ad;
    return MA_TRUE;
}